

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderConfig.cpp
# Opt level: O1

Visibility glu::parseWindowVisibility(CommandLine *cmdLine)

{
  WindowVisibility WVar1;
  InternalError *this;
  string local_40;
  
  WVar1 = tcu::CommandLine::getVisibility(cmdLine);
  if (WVar1 < WINDOWVISIBILITY_LAST) {
    return *(Visibility *)(&DAT_00369cdc + (ulong)WVar1 * 4);
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Unsupported window visibility","");
  tcu::InternalError::InternalError(this,&local_40);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

RenderConfig::Visibility parseWindowVisibility (const tcu::CommandLine& cmdLine)
{
	switch (cmdLine.getVisibility())
	{
		case tcu::WINDOWVISIBILITY_HIDDEN:		return RenderConfig::VISIBILITY_HIDDEN;
		case tcu::WINDOWVISIBILITY_WINDOWED:	return RenderConfig::VISIBILITY_VISIBLE;
		case tcu::WINDOWVISIBILITY_FULLSCREEN:	return RenderConfig::VISIBILITY_FULLSCREEN;
		default:
			throw tcu::InternalError("Unsupported window visibility");
	}
}